

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::ComprehensionSpec::ComprehensionSpec
          (ComprehensionSpec *this,Kind kind,Fodder *open_fodder,Fodder *var_fodder,Identifier *var,
          Fodder *in_fodder,AST *expr)

{
  undefined4 in_ESI;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RDI;
  pointer in_R8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *unaff_retaddr;
  pointer in_stack_00000008;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_> *__x;
  
  *(undefined4 *)
   &(in_RDI->
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    )._M_impl.super__Vector_impl_data._M_start = in_ESI;
  __x = in_RDI;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(unaff_retaddr,in_RDI);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(unaff_retaddr,__x);
  in_RDI[2].
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = in_R8;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(unaff_retaddr,__x);
  in_RDI[3].
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_00000008;
  return;
}

Assistant:

ComprehensionSpec(Kind kind, const Fodder &open_fodder, const Fodder &var_fodder,
                      const Identifier *var, const Fodder &in_fodder, AST *expr)
        : kind(kind),
          openFodder(open_fodder),
          varFodder(var_fodder),
          var(var),
          inFodder(in_fodder),
          expr(expr)
    {
    }